

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

char * uv__cgroup1_find_memory_controller(char *buf,int *n)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char *local_20;
  char *p;
  int *n_local;
  char *buf_local;
  
  local_20 = strchr(buf,0x3a);
  while( true ) {
    bVar3 = false;
    if (local_20 != (char *)0x0) {
      iVar1 = strncmp(local_20,":memory:",8);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    local_20 = strchr(local_20,10);
    if (local_20 != (char *)0x0) {
      local_20 = strchr(local_20,0x3a);
    }
  }
  if (local_20 != (char *)0x0) {
    local_20 = local_20 + 9;
    sVar2 = strcspn(local_20,"\n");
    *n = (int)sVar2;
  }
  return local_20;
}

Assistant:

static char* uv__cgroup1_find_memory_controller(char buf[static 1024],
                                                int* n) {
  char* p;

  /* Seek to the memory controller line. */
  p = strchr(buf, ':');
  while (p != NULL && strncmp(p, ":memory:", 8)) {
    p = strchr(p, '\n');
    if (p != NULL)
      p = strchr(p, ':');
  }

  if (p != NULL) {
    /* Determine the length of the mount path. */
    p = p + strlen(":memory:/");
    *n = (int) strcspn(p, "\n");
  }

  return p;
}